

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmldoc.cpp
# Opt level: O3

void libcellml::structuredErrorCallback(void *userData,xmlErrorPtr error)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  string errorString;
  value_type local_38;
  
  if (structuredErrorCallback(void*,_xmlError*)::newLineRegex_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&structuredErrorCallback(void*,_xmlError*)::newLineRegex_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&structuredErrorCallback(void*,_xmlError*)::newLineRegex_abi_cxx11_,"\\n",0x10);
      __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                   &structuredErrorCallback(void*,_xmlError*)::newLineRegex_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&structuredErrorCallback(void*,_xmlError*)::newLineRegex_abi_cxx11_);
    }
  }
  __s = error->message;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  sVar2 = strlen(__s);
  std::
  __regex_replace<std::back_insert_iterator<std::__cxx11::string>,char_const*,std::__cxx11::regex_traits<char>,char>
            (&local_38,__s,__s + sVar2,
             &structuredErrorCallback(void*,_xmlError*)::newLineRegex_abi_cxx11_,".",1,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(**(long **)((long)userData + 0x1a8) + 8),&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,
                    CONCAT71(local_38.field_2._M_allocated_capacity._1_7_,
                             local_38.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void structuredErrorCallback(void *userData, XML_ERROR_CALLBACK_ARGUMENT_TYPE error)
{
    static const std::regex newLineRegex("\\n");
    // Swap libxml2 carriage return for a period.
    std::string errorString = std::regex_replace(error->message, newLineRegex, ".");
    auto context = reinterpret_cast<xmlParserCtxtPtr>(userData);
    auto doc = reinterpret_cast<XmlDoc *>(context->_private);
    doc->addXmlError(errorString);
}